

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

int ShowDemoWindowWidgets::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *data)

{
  int iVar1;
  int *piVar2;
  char *__dest;
  int iVar3;
  
  if (data->EventFlag == 0x40000) {
    piVar2 = (int *)data->UserData;
    __dest = *(char **)(piVar2 + 2);
    if (__dest != data->Buf) {
      __assert_fail("my_str->begin() == data->Buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_demo.cpp"
                    ,0x40d,
                    "static int ShowDemoWindowWidgets()::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *)"
                   );
    }
    iVar1 = data->BufSize;
    iVar3 = piVar2[1];
    if (iVar3 < iVar1) {
      if (iVar3 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar3 / 2 + iVar3;
      }
      if (iVar3 <= iVar1) {
        iVar3 = iVar1;
      }
      __dest = (char *)ImGui::MemAlloc((long)iVar3);
      if (*(void **)(piVar2 + 2) != (void *)0x0) {
        memcpy(__dest,*(void **)(piVar2 + 2),(long)*piVar2);
        ImGui::MemFree(*(void **)(piVar2 + 2));
      }
      *(char **)(piVar2 + 2) = __dest;
      piVar2[1] = iVar3;
    }
    *piVar2 = iVar1;
    data->Buf = __dest;
  }
  return 0;
}

Assistant:

static int MyResizeCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
                    {
                        ImVector<char>* my_str = (ImVector<char>*)data->UserData;
                        IM_ASSERT(my_str->begin() == data->Buf);
                        my_str->resize(data->BufSize);  // NB: On resizing calls, generally data->BufSize == data->BufTextLen + 1
                        data->Buf = my_str->begin();
                    }
                    return 0;
                }